

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SystemInformation.cxx
# Opt level: O3

int cmsys::anon_unknown_3::GetFieldsFromFile<long_long>
              (char *fileName,char **fieldNames,longlong *values)

{
  ulong uVar1;
  int iVar2;
  int iVar3;
  FILE *__stream;
  int *piVar4;
  char *pcVar5;
  istringstream *piVar6;
  long lVar7;
  size_t sVar8;
  long lVar9;
  long lVar10;
  ulong uVar11;
  ulong uVar12;
  bool bVar13;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  fields;
  char buf [1024];
  long *local_498 [2];
  long local_488 [2];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_478;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_458;
  longlong *local_440;
  istringstream local_438 [120];
  ios_base local_3c0 [912];
  
  local_458.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_458.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_458.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_440 = values;
  __stream = fopen64(fileName,"r");
  iVar2 = -1;
  if (__stream != (FILE *)0x0) {
    iVar3 = 0;
    memset(local_438,0,0x400);
    iVar2 = feof(__stream);
    bVar13 = true;
    if (iVar2 == 0) {
LAB_004d05d4:
      iVar2 = ferror(__stream);
      if (iVar2 == 0) {
        piVar4 = __errno_location();
        *piVar4 = 0;
        pcVar5 = fgets((char *)local_438,0x400,__stream);
        piVar6 = local_438;
        if (pcVar5 != (char *)0x0) {
          do {
            if (*piVar6 == (istringstream)0xa) {
              *piVar6 = (istringstream)0x0;
            }
            else if (*piVar6 == (istringstream)0x0) goto LAB_004d0648;
            piVar6 = piVar6 + 1;
          } while( true );
        }
        iVar2 = ferror(__stream);
        if ((iVar2 != 0) && (*piVar4 == 4)) {
          clearerr(__stream);
        }
        iVar2 = feof(__stream);
        if (iVar2 == 0) goto LAB_004d05d4;
      }
      bVar13 = iVar3 == 0;
    }
LAB_004d06a9:
    iVar3 = ferror(__stream);
    fclose(__stream);
    iVar2 = -1;
    if (!(bool)(iVar3 != 0 | bVar13)) {
      lVar9 = 0;
      do {
        lVar7 = lVar9;
        pcVar5 = fieldNames[lVar7];
        if (pcVar5 == (char *)0x0) {
          iVar2 = 0;
          goto LAB_004d0872;
        }
        local_498[0] = local_488;
        sVar8 = strlen(pcVar5);
        std::__cxx11::string::_M_construct<char_const*>((string *)local_498,pcVar5,pcVar5 + sVar8);
        if ((long)local_458.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish -
            (long)local_458.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start == 0) {
          bVar13 = true;
        }
        else {
          uVar12 = (long)local_458.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish -
                   (long)local_458.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start >> 5;
          uVar11 = 0;
          lVar9 = std::__cxx11::string::find
                            ((char *)local_458.
                                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_start,(ulong)local_498[0],0
                            );
          if (lVar9 == -1) {
            lVar9 = 0x20;
            uVar1 = 1;
            do {
              uVar11 = uVar1;
              if (uVar12 + (uVar12 == 0) == uVar11) {
                bVar13 = uVar12 <= uVar11;
                goto LAB_004d083d;
              }
              lVar10 = std::__cxx11::string::find
                                 ((char *)((long)&((local_458.
                                                                                                        
                                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start)->
                                                  _M_dataplus)._M_p + lVar9),(ulong)local_498[0],0);
              lVar9 = lVar9 + 0x20;
              uVar1 = uVar11 + 1;
            } while (lVar10 == -1);
            bVar13 = uVar12 <= uVar11;
          }
          else {
            bVar13 = false;
          }
          std::__cxx11::string::substr
                    ((ulong)&local_478,
                     (ulong)(local_458.
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start + uVar11));
          std::__cxx11::istringstream::istringstream(local_438,(string *)&local_478,_S_in);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_478._M_dataplus._M_p != &local_478.field_2) {
            operator_delete(local_478._M_dataplus._M_p,local_478.field_2._M_allocated_capacity + 1);
          }
          std::istream::_M_extract<long_long>((longlong *)local_438);
          std::__cxx11::istringstream::~istringstream(local_438);
          std::ios_base::~ios_base(local_3c0);
        }
LAB_004d083d:
        if (local_498[0] != local_488) {
          operator_delete(local_498[0],local_488[0] + 1);
        }
        lVar9 = lVar7 + 1;
      } while (!bVar13);
      iVar2 = -2 - (int)lVar7;
    }
  }
LAB_004d0872:
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_458);
  return iVar2;
LAB_004d0648:
  local_478._M_dataplus._M_p = (pointer)&local_478.field_2;
  sVar8 = strlen((char *)local_438);
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_478,local_438,local_438 + sVar8);
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<std::__cxx11::string>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_458,
             &local_478);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_478._M_dataplus._M_p != &local_478.field_2) {
    operator_delete(local_478._M_dataplus._M_p,local_478.field_2._M_allocated_capacity + 1);
  }
  iVar3 = iVar3 + 1;
  iVar2 = feof(__stream);
  bVar13 = false;
  if (iVar2 != 0) goto LAB_004d06a9;
  goto LAB_004d05d4;
}

Assistant:

int GetFieldsFromFile(
      const char *fileName,
      const char **fieldNames,
      T *values)
{
  std::vector<std::string> fields;
  if (!LoadLines(fileName,fields))
    {
    return -1;
    }
  int i=0;
  while (fieldNames[i]!=NULL)
    {
    int ierr=NameValue(fields,fieldNames[i],values[i]);
    if (ierr)
      {
      return -(i+2);
      }
    i+=1;
    }
  return 0;
}